

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_list(textblock *tb,char **list,wchar_t n)

{
  char *pcVar1;
  wchar_t local_20;
  wchar_t i;
  wchar_t n_local;
  char **list_local;
  textblock *tb_local;
  
  if (L'\0' < n) {
    textblock_append(tb," %s",*list);
  }
  for (local_20 = L'\x01'; local_20 < n; local_20 = local_20 + L'\x01') {
    pcVar1 = " and";
    if (local_20 < n + L'\xffffffff') {
      pcVar1 = ",";
    }
    textblock_append(tb,"%s %s",pcVar1,list[local_20]);
  }
  return;
}

Assistant:

static void shape_lore_append_list(textblock *tb,
	const char * const *list, int n)
{
	int i;

	if (n > 0) {
		textblock_append(tb, " %s", list[0]);
	}
	for (i = 1; i < n; ++i) {
		textblock_append(tb, "%s %s", (i < n - 1) ? "," : " and",
			list[i]);
	}
}